

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *makefile,
          string *tgt)

{
  cmOutputConverter *this_00;
  cmGlobalGenerator *pcVar1;
  string *psVar2;
  string tgt2;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat(&local_78,this_00,makefile,SHELL);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  if ((pcVar1->MakeSilentFlag)._M_string_length != 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(pcVar1->MakeSilentFlag)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (pcVar1[1].MakeSilentFlag.field_2._M_local_buf[1] == '\x01') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (tgt->_M_string_length != 0) {
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmLocalGenerator::MaybeConvertToRelativePath(&local_78,(cmLocalGenerator *)this,psVar2,tgt);
    cmSystemTools::ConvertToOutputSlashes(&local_78);
    if (this->MakeCommandEscapeTargetTwice == true) {
      cmOutputConverter::EscapeForShell(&local_50,this_00,&local_78,true,false,false);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    cmOutputConverter::EscapeForShell(&local_50,this_00,&local_78,true,false,false);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const std::string& makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd;
  cmd += "$(MAKE) -f ";
  cmd += this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL);
  cmd += " ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 =
      this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}